

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManEquivMark(Gia_Man_t *p,char *pFileName,int fSkipSome,int fVerbose)

{
  Gia_Man_t *pGVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *local_58;
  Vec_Int_t *vTrace;
  int Counter;
  int nLitsAll;
  int nLits;
  int nAddPos;
  int iLit;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pMiter;
  int fVerbose_local;
  int fSkipSome_local;
  char *pFileName_local;
  Gia_Man_t *p_local;
  
  Counter = 0;
  vTrace._0_4_ = 0;
  pMiter._0_4_ = fVerbose;
  pMiter._4_4_ = fSkipSome;
  _fVerbose_local = pFileName;
  pFileName_local = (char *)p;
  vTrace._4_4_ = Gia_ManEquivCountLitsAll(p);
  if (vTrace._4_4_ == 0) {
    Abc_Print(1,"Gia_ManEquivMark(): Current AIG does not have equivalences.\n");
  }
  else {
    pTemp = Gia_AigerRead(_fVerbose_local,0,0,0);
    if (pTemp == (Gia_Man_t *)0x0) {
      Abc_Print(1,"Gia_ManEquivMark(): Input file %s could not be read.\n",_fVerbose_local);
    }
    else {
      if (pMiter._4_4_ == 0) {
        iVar4 = Gia_ManPoNum(pTemp);
        iVar3 = Gia_ManPoNum((Gia_Man_t *)pFileName_local);
        if (iVar4 != iVar3 + vTrace._4_4_) {
          uVar2 = Gia_ManPoNum(pTemp);
          uVar5 = Gia_ManPoNum((Gia_Man_t *)pFileName_local);
          Abc_Print(1,
                    "Gia_ManEquivMark(): The number of POs is not correct: MiterPONum(%d) != AIGPONum(%d) + AIGEquivNum(%d).\n"
                    ,(ulong)uVar2,(ulong)uVar5,(ulong)vTrace._4_4_);
          Gia_ManStop(pTemp);
          return;
        }
        Counter = 0;
        for (nAddPos = 0; iVar4 = nAddPos, iVar3 = Gia_ManObjNum((Gia_Man_t *)pFileName_local),
            iVar4 < iVar3; nAddPos = nAddPos + 1) {
          iVar4 = Gia_ObjRepr((Gia_Man_t *)pFileName_local,nAddPos);
          pGVar1 = pTemp;
          if (iVar4 != 0xfffffff) {
            iVar4 = Gia_ManPoNum((Gia_Man_t *)pFileName_local);
            iVar4 = iVar4 + Counter;
            Counter = Counter + 1;
            _iLit = Gia_ManPo(pGVar1,iVar4);
            iVar4 = Gia_ObjFaninLit0p(pTemp,_iLit);
            if (iVar4 == 0) {
              Gia_ObjSetProved((Gia_Man_t *)pFileName_local,nAddPos);
              vTrace._0_4_ = (uint)vTrace + 1;
            }
          }
        }
        if (Counter != vTrace._4_4_) {
          __assert_fail("nLits == nLitsAll",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x63f,"void Gia_ManEquivMark(Gia_Man_t *, char *, int, int)");
        }
      }
      else {
        local_58 = Vec_IntAlloc(100);
        pObj = (Gia_Obj_t *)
               Gia_ManSpecReduceTrace((Gia_Man_t *)pFileName_local,local_58,(Vec_Int_t *)0x0);
        Gia_ManStop((Gia_Man_t *)pObj);
        uVar2 = Vec_IntSize(local_58);
        if (uVar2 != vTrace._4_4_) {
          __assert_fail("Vec_IntSize(vTrace) == nLitsAll",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x607,"void Gia_ManEquivMark(Gia_Man_t *, char *, int, int)");
        }
        nLitsAll = 0;
        for (nAddPos = 0; iVar4 = nAddPos, iVar3 = Vec_IntSize(local_58), iVar4 < iVar3;
            nAddPos = nAddPos + 1) {
          nLits = Vec_IntEntry(local_58,nAddPos);
          if (nLits != 0) {
            nLitsAll = nLitsAll + 1;
          }
        }
        iVar4 = Gia_ManPoNum(pTemp);
        iVar3 = Gia_ManPoNum((Gia_Man_t *)pFileName_local);
        if (iVar4 != iVar3 + nLitsAll) {
          uVar2 = Gia_ManPoNum(pTemp);
          uVar5 = Gia_ManPoNum((Gia_Man_t *)pFileName_local);
          Abc_Print(1,
                    "Gia_ManEquivMark(): The number of POs is not correct: MiterPONum(%d) != AIGPONum(%d) + AIGFilteredEquivNum(%d).\n"
                    ,(ulong)uVar2,(ulong)uVar5,(ulong)(uint)nLitsAll);
          Gia_ManStop(pTemp);
          Vec_IntFreeP(&local_58);
          return;
        }
        vTrace._0_4_ = 0;
        nLits = 0;
        Counter = 0;
        for (nAddPos = 0; iVar4 = nAddPos, iVar3 = Gia_ManObjNum((Gia_Man_t *)pFileName_local),
            iVar4 < iVar3; nAddPos = nAddPos + 1) {
          iVar3 = Gia_ObjRepr((Gia_Man_t *)pFileName_local,nAddPos);
          iVar4 = Counter;
          if (iVar3 != 0xfffffff) {
            Counter = Counter + 1;
            iVar4 = Vec_IntEntry(local_58,iVar4);
            pGVar1 = pTemp;
            if (iVar4 != 0) {
              iVar4 = Gia_ManPoNum((Gia_Man_t *)pFileName_local);
              iVar4 = iVar4 + nLits;
              nLits = nLits + 1;
              _iLit = Gia_ManPo(pGVar1,iVar4);
              iVar4 = Gia_ObjFaninLit0p(pTemp,_iLit);
              if (iVar4 == 0) {
                Gia_ObjSetProved((Gia_Man_t *)pFileName_local,nAddPos);
                vTrace._0_4_ = (uint)vTrace + 1;
              }
            }
          }
        }
        if (Counter != vTrace._4_4_) {
          __assert_fail("nLits == nLitsAll",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x625,"void Gia_ManEquivMark(Gia_Man_t *, char *, int, int)");
        }
        if (nLits != nLitsAll) {
          __assert_fail("iLit == nAddPos",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x626,"void Gia_ManEquivMark(Gia_Man_t *, char *, int, int)");
        }
        Vec_IntFreeP(&local_58);
      }
      if ((int)pMiter != 0) {
        Abc_Print(1,"Set %d equivalences as proved.\n",(ulong)(uint)vTrace);
      }
      Gia_ManStop(pTemp);
    }
  }
  return;
}

Assistant:

void Gia_ManEquivMark( Gia_Man_t * p, char * pFileName, int fSkipSome, int fVerbose )
{
    Gia_Man_t * pMiter, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLit, nAddPos, nLits = 0;
    int nLitsAll, Counter = 0;
    nLitsAll = Gia_ManEquivCountLitsAll( p );
    if ( nLitsAll == 0 )
    {
        Abc_Print( 1, "Gia_ManEquivMark(): Current AIG does not have equivalences.\n" );
        return;
    }
    // read AIGER file
    pMiter = Gia_AigerRead( pFileName, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        Abc_Print( 1, "Gia_ManEquivMark(): Input file %s could not be read.\n", pFileName );
        return;
    }
    if ( fSkipSome )
    {
        Vec_Int_t * vTrace = Vec_IntAlloc( 100 );
        pTemp = Gia_ManSpecReduceTrace( p, vTrace, NULL );
        Gia_ManStop( pTemp );
        assert( Vec_IntSize(vTrace) == nLitsAll );
        // count the number of non-zero entries
        nAddPos = 0;
        Vec_IntForEachEntry( vTrace, iLit, i )
            if ( iLit )
                nAddPos++;
        // check the number
        if ( Gia_ManPoNum(pMiter) != Gia_ManPoNum(p) + nAddPos )
        {
            Abc_Print( 1, "Gia_ManEquivMark(): The number of POs is not correct: MiterPONum(%d) != AIGPONum(%d) + AIGFilteredEquivNum(%d).\n",
                Gia_ManPoNum(pMiter), Gia_ManPoNum(p), nAddPos );
            Gia_ManStop( pMiter );
            Vec_IntFreeP( &vTrace );
            return;
        }
        // mark corresponding POs as solved
        nLits = iLit = Counter = 0;
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
        {
            if ( Gia_ObjRepr(p, i) == GIA_VOID )
                continue;
            if ( Vec_IntEntry( vTrace, nLits++ ) == 0 )
                continue;
            pObj = Gia_ManPo( pMiter, Gia_ManPoNum(p) + iLit++ );
            if ( Gia_ObjFaninLit0p(pMiter, pObj) == 0 ) // const 0 - proven
            {
                Gia_ObjSetProved(p, i);
                Counter++;
            }
        }
        assert( nLits == nLitsAll );
        assert( iLit == nAddPos );
        Vec_IntFreeP( &vTrace );
    }
    else
    {
        if ( Gia_ManPoNum(pMiter) != Gia_ManPoNum(p) + nLitsAll )
        {
            Abc_Print( 1, "Gia_ManEquivMark(): The number of POs is not correct: MiterPONum(%d) != AIGPONum(%d) + AIGEquivNum(%d).\n",
                Gia_ManPoNum(pMiter), Gia_ManPoNum(p), nLitsAll );
            Gia_ManStop( pMiter );
            return;
        }
        // mark corresponding POs as solved
        nLits = 0;
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
        {
            if ( Gia_ObjRepr(p, i) == GIA_VOID )
                continue;
            pObj = Gia_ManPo( pMiter, Gia_ManPoNum(p) + nLits++ );
            if ( Gia_ObjFaninLit0p(pMiter, pObj) == 0 ) // const 0 - proven
            {
                Gia_ObjSetProved(p, i);
                Counter++;
            }
        }
        assert( nLits == nLitsAll );
    }
    if ( fVerbose )
        Abc_Print( 1, "Set %d equivalences as proved.\n", Counter );
    Gia_ManStop( pMiter );
}